

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O2

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig(cmScriptGenerator *this,ostream *os,Indent indent)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  ostream *poVar5;
  ostream *poVar6;
  undefined4 in_register_00000014;
  cmScriptGeneratorIndent indent_00;
  char *pcVar7;
  pointer pbVar8;
  string config_test;
  allocator local_89;
  uint local_88;
  uint local_84;
  ostream *local_80;
  undefined8 local_78;
  string local_70;
  string local_50;
  
  local_78 = CONCAT44(in_register_00000014,indent.Level);
  pbVar8 = (this->ConfigurationTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->ConfigurationTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar4) {
    local_84 = indent.Level + 2;
    local_88 = (uint)CONCAT71((uint7)(uint3)(local_84 >> 8),1);
    local_80 = os;
    for (; pbVar8 != pbVar4; pbVar8 = pbVar8 + 1) {
      pcVar1 = (pbVar8->_M_dataplus)._M_p;
      std::__cxx11::string::string((string *)&local_50,pcVar1,(allocator *)&local_70);
      bVar2 = GeneratesForConfig(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_70,pcVar1,&local_89);
        CreateConfigTest(&local_50,this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        poVar5 = operator<<(local_80,(cmScriptGeneratorIndent)(int)local_78);
        pcVar7 = "elseif(";
        if ((local_88 & 1) != 0) {
          pcVar7 = "if(";
        }
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,(string *)&local_50);
        std::operator<<(poVar5,")\n");
        std::__cxx11::string::string((string *)&local_70,pcVar1,&local_89);
        (*this->_vptr_cmScriptGenerator[5])(this,local_80,&local_70,(ulong)local_84);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_88 = 0;
      }
      pbVar4 = (this->ConfigurationTypes->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((local_88 & 1) == 0) {
      iVar3 = (*this->_vptr_cmScriptGenerator[7])(this);
      poVar5 = local_80;
      indent_00.Level = (int)local_78;
      if ((char)iVar3 != '\0') {
        poVar6 = operator<<(local_80,indent_00);
        std::operator<<(poVar6,"else()\n");
        (*this->_vptr_cmScriptGenerator[6])(this,poVar5,(ulong)local_84);
      }
      poVar5 = operator<<(poVar5,indent_00);
      std::operator<<(poVar5,"endif()\n");
    }
    return;
  }
  GenerateScriptActionsOnce(this,os,indent);
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent indent)
{
  if (this->ConfigurationTypes->empty()) {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
  } else {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for (std::vector<std::string>::const_iterator i =
           this->ConfigurationTypes->begin();
         i != this->ConfigurationTypes->end(); ++i) {
      const char* config = i->c_str();
      if (this->GeneratesForConfig(config)) {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(config);
        os << indent << (first ? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, config, indent.Next());
        first = false;
      }
    }
    if (!first) {
      if (this->NeedsScriptNoConfig()) {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
      }
      os << indent << "endif()\n";
    }
  }
}